

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_DRBG.c
# Opt level: O3

_Bool generate_sha2_512(uint8_t *output,EverCrypt_DRBG_state_s *st,uint32_t n,
                       uint8_t *additional_input,uint32_t additional_input_len)

{
  uint8_t *puVar1;
  long lVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  size_t __n;
  undefined1 *puVar10;
  uint *puVar11;
  undefined1 uVar12;
  _Bool _Var13;
  uint32_t uVar14;
  undefined7 extraout_var;
  undefined4 in_register_00000014;
  undefined8 uVar15;
  ulong uVar16;
  uint8_t *puVar17;
  uint8_t *puVar18;
  undefined4 in_register_00000084;
  ulong uVar19;
  uint8_t *puVar20;
  uint8_t *puVar21;
  uint32_t input_len0;
  uint uVar22;
  uint8_t *puVar23;
  ulong uVar24;
  uint8_t auStack_c0 [8];
  uint32_t *local_b8;
  long local_b0;
  uint8_t *local_a8;
  uint8_t *local_a0;
  size_t local_98;
  uint8_t *local_90;
  uint8_t auStack_88 [4];
  uint local_84;
  ulong local_80;
  undefined8 local_78;
  ulong local_70;
  undefined1 *local_68;
  ulong local_60;
  uint8_t *local_58;
  uint8_t *local_50;
  uint *local_48;
  EverCrypt_DRBG_state_s *local_40;
  ulong local_38;
  
  local_60 = CONCAT44(in_register_00000084,additional_input_len);
  local_50 = (uint8_t *)CONCAT44(in_register_00000014,n);
  uVar12 = 0;
  if ((additional_input_len <= Hacl_HMAC_DRBG_max_additional_input_length) &&
     (n <= Hacl_HMAC_DRBG_max_output_length)) {
    builtin_memcpy(auStack_c0,"1/\x17",4);
    auStack_c0[4] = '\0';
    auStack_c0[5] = '\0';
    auStack_c0[6] = '\0';
    auStack_c0[7] = '\0';
    local_40 = st;
    uVar14 = Hacl_HMAC_DRBG_min_length('\x03');
    uVar19 = (ulong)uVar14;
    lVar2 = -(uVar19 + 0xf & 0xfffffffffffffff0);
    puVar21 = (uint8_t *)((long)&local_b8 + lVar2);
    puVar17 = auStack_c0 + lVar2;
    local_68 = (undefined1 *)&local_b8;
    builtin_memcpy(auStack_c0 + lVar2,"X/\x17",4);
    puVar17[4] = '\0';
    puVar17[5] = '\0';
    puVar17[6] = '\0';
    puVar17[7] = '\0';
    memset(puVar21,0,uVar19);
    puVar18 = auStack_c0 + lVar2;
    builtin_memcpy(auStack_c0 + lVar2,"b/\x17",4);
    puVar18[4] = '\0';
    puVar18[5] = '\0';
    puVar18[6] = '\0';
    puVar18[7] = '\0';
    _Var13 = Lib_RandomBuffer_System_randombytes(puVar21,uVar14);
    uVar24 = local_60;
    uVar16 = CONCAT71(extraout_var,_Var13);
    if (_Var13) {
      local_84 = (uint)uVar16;
      local_90 = (local_40->field_1).case_SHA1_s.k;
      local_48 = (uint *)(local_40->field_1).case_SHA1_s.v;
      local_b8 = (local_40->field_1).case_SHA1_s.reseed_counter;
      iVar3 = (int)local_60;
      uVar16 = (ulong)(uVar14 + iVar3);
      local_80 = CONCAT71(local_80._1_7_,local_40->tag);
      lVar2 = -(uVar16 + 0xf & 0xfffffffffffffff0);
      puVar23 = puVar21 + lVar2;
      local_58 = additional_input;
      local_38 = uVar16;
      puVar23[-8] = 0xc0;
      puVar23[-7] = '/';
      puVar23[-6] = '\x17';
      puVar23[-5] = '\0';
      puVar23[-4] = '\0';
      puVar23[-3] = '\0';
      puVar23[-2] = '\0';
      puVar23[-1] = '\0';
      memset(puVar23,0,uVar16);
      puVar23[-8] = 0xce;
      puVar23[-7] = '/';
      puVar23[-6] = '\x17';
      puVar23[-5] = '\0';
      puVar23[-4] = '\0';
      puVar23[-3] = '\0';
      puVar23[-2] = '\0';
      puVar23[-1] = '\0';
      memcpy(puVar23,puVar21,uVar19);
      puVar1 = local_58;
      local_78 = puVar23;
      local_70 = uVar24 & 0xffffffff;
      puVar23[-8] = 0xe5;
      puVar23[-7] = '/';
      puVar23[-6] = '\x17';
      puVar23[-5] = '\0';
      puVar23[-4] = '\0';
      puVar23[-3] = '\0';
      puVar23[-2] = '\0';
      puVar23[-1] = '\0';
      memcpy(puVar23 + uVar19,puVar1,uVar24 & 0xffffffff);
      if ((char)local_80 != '\x03') {
        uVar15 = 0x63f;
LAB_00173679:
        puVar23[-8] = 0x80;
        puVar23[-7] = '6';
        puVar23[-6] = '\x17';
        puVar23[-5] = '\0';
        puVar23[-4] = '\0';
        puVar23[-3] = '\0';
        puVar23[-2] = '\0';
        puVar23[-1] = '\0';
        printf("KaRaMeL abort at %s:%d\n%s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/EverCrypt_DRBG.c"
               ,uVar15,"unreachable (pattern matches are exhaustive in F*)");
        *(code **)(puVar23 + -8) = EverCrypt_DRBG_uninstantiate;
        exit(0xff);
      }
      uVar22 = iVar3 + uVar14 + 0x41;
      uVar19 = (ulong)uVar22;
      uVar16 = uVar19 + 0xf & 0xfffffffffffffff0;
      puVar20 = puVar23 + -uVar16;
      puVar20[-8] = '\x18';
      puVar20[-7] = '0';
      puVar20[-6] = '\x17';
      puVar20[-5] = '\0';
      puVar20[-4] = '\0';
      puVar20[-3] = '\0';
      puVar20[-2] = '\0';
      puVar20[-1] = '\0';
      memset(puVar20,0,uVar19);
      uVar15 = *(undefined8 *)local_48;
      uVar4 = *(undefined8 *)((long)local_48 + 8);
      uVar5 = *(undefined8 *)((long)local_48 + 0x10);
      uVar6 = *(undefined8 *)((long)local_48 + 0x18);
      uVar7 = *(undefined8 *)((long)local_48 + 0x20);
      uVar8 = *(undefined8 *)((long)local_48 + 0x28);
      uVar9 = *(undefined8 *)((long)local_48 + 0x38);
      local_80 = uVar16;
      *(undefined8 *)(puVar23 + -uVar16 + 0x30) = *(undefined8 *)((long)local_48 + 0x30);
      *(undefined8 *)(puVar23 + -uVar16 + 0x30 + 8) = uVar9;
      *(undefined8 *)puVar20 = uVar15;
      *(undefined8 *)(puVar20 + 8) = uVar4;
      *(undefined8 *)(puVar20 + 0x10) = uVar5;
      *(undefined8 *)(puVar20 + 0x18) = uVar6;
      *(undefined8 *)(puVar20 + 0x20) = uVar7;
      *(undefined8 *)(puVar20 + 0x28) = uVar8;
      uVar24 = local_38;
      puVar23 = local_78;
      puVar1 = local_90;
      if (local_38 == 0) {
        puVar20[0x40] = '\0';
        puVar20[-8] = 0xc5;
        puVar20[-7] = '1';
        puVar20[-6] = '\x17';
        puVar20[-5] = '\0';
        puVar20[-4] = '\0';
        puVar20[-3] = '\0';
        puVar20[-2] = '\0';
        puVar20[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(puVar20,puVar1,0x40,puVar20,uVar22);
        puVar11 = local_48;
        puVar20[-8] = 0xdf;
        puVar20[-7] = '1';
        puVar20[-6] = '\x17';
        puVar20[-5] = '\0';
        puVar20[-4] = '\0';
        puVar20[-3] = '\0';
        puVar20[-2] = '\0';
        puVar20[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512((uint8_t *)puVar11,puVar20,0x40,(uint8_t *)puVar11,0x40);
        uVar15 = *(undefined8 *)puVar20;
        uVar4 = *(undefined8 *)(puVar20 + 8);
        uVar5 = *(undefined8 *)(puVar20 + 0x10);
        uVar6 = *(undefined8 *)(puVar20 + 0x18);
        uVar7 = *(undefined8 *)(puVar20 + 0x20);
        uVar8 = *(undefined8 *)(puVar20 + 0x28);
        uVar9 = *(undefined8 *)(puVar20 + 0x38);
        *(undefined8 *)(puVar1 + 0x30) = *(undefined8 *)(puVar20 + 0x30);
        *(undefined8 *)(puVar1 + 0x38) = uVar9;
        *(undefined8 *)(puVar1 + 0x20) = uVar7;
        *(undefined8 *)(puVar1 + 0x28) = uVar8;
        *(undefined8 *)(puVar1 + 0x10) = uVar5;
        *(undefined8 *)(puVar1 + 0x18) = uVar6;
        *(undefined8 *)puVar1 = uVar15;
        *(undefined8 *)(puVar1 + 8) = uVar4;
      }
      else {
        local_b0 = -uVar16;
        builtin_memcpy(puVar21 + -uVar16 + lVar2 + -8,"j0\x17",4);
        puVar20[-4] = '\0';
        puVar20[-3] = '\0';
        puVar20[-2] = '\0';
        puVar20[-1] = '\0';
        memcpy(puVar20 + 0x41,puVar23,uVar24);
        puVar21 = local_90;
        puVar20[0x40] = '\0';
        puVar20[-8] = 0x8c;
        puVar20[-7] = '0';
        puVar20[-6] = '\x17';
        puVar20[-5] = '\0';
        puVar20[-4] = '\0';
        puVar20[-3] = '\0';
        puVar20[-2] = '\0';
        puVar20[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(puVar20,puVar21,0x40,puVar20,uVar22);
        puVar11 = local_48;
        local_98 = uVar19;
        puVar20[-8] = 0xb0;
        puVar20[-7] = '0';
        puVar20[-6] = '\x17';
        puVar20[-5] = '\0';
        puVar20[-4] = '\0';
        puVar20[-3] = '\0';
        puVar20[-2] = '\0';
        puVar20[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512((uint8_t *)puVar11,puVar20,0x40,(uint8_t *)puVar11,0x40);
        __n = local_98;
        local_a8 = puVar20;
        uVar15 = *(undefined8 *)puVar20;
        uVar4 = *(undefined8 *)(puVar20 + 8);
        uVar5 = *(undefined8 *)(puVar20 + 0x10);
        uVar6 = *(undefined8 *)(puVar20 + 0x18);
        uVar7 = *(undefined8 *)(puVar20 + 0x20);
        uVar8 = *(undefined8 *)(puVar20 + 0x28);
        uVar9 = *(undefined8 *)(puVar20 + 0x38);
        *(undefined8 *)(puVar21 + 0x30) = *(undefined8 *)(puVar20 + 0x30);
        *(undefined8 *)(puVar21 + 0x38) = uVar9;
        *(undefined8 *)(puVar21 + 0x20) = uVar7;
        *(undefined8 *)(puVar21 + 0x28) = uVar8;
        *(undefined8 *)(puVar21 + 0x10) = uVar5;
        *(undefined8 *)(puVar21 + 0x18) = uVar6;
        *(undefined8 *)puVar21 = uVar15;
        *(undefined8 *)(puVar21 + 8) = uVar4;
        puVar23 = puVar20 + -local_80;
        local_a0 = puVar20;
        puVar23[-8] = 0xff;
        puVar23[-7] = '0';
        puVar23[-6] = '\x17';
        puVar23[-5] = '\0';
        puVar23[-4] = '\0';
        puVar23[-3] = '\0';
        puVar23[-2] = '\0';
        puVar23[-1] = '\0';
        memset(puVar23,0,__n);
        uVar15 = *(undefined8 *)((long)puVar11 + 8);
        uVar4 = *(undefined8 *)((long)puVar11 + 0x10);
        uVar5 = *(undefined8 *)((long)puVar11 + 0x18);
        uVar6 = *(undefined8 *)((long)puVar11 + 0x20);
        uVar7 = *(undefined8 *)((long)puVar11 + 0x28);
        uVar8 = *(undefined8 *)((long)puVar11 + 0x30);
        uVar9 = *(undefined8 *)((long)puVar11 + 0x38);
        *(undefined8 *)puVar23 = *(undefined8 *)puVar11;
        *(undefined8 *)(puVar23 + 8) = uVar15;
        *(undefined8 *)(puVar23 + 0x10) = uVar4;
        *(undefined8 *)(puVar23 + 0x18) = uVar5;
        *(undefined8 *)(puVar23 + 0x20) = uVar6;
        *(undefined8 *)(puVar23 + 0x28) = uVar7;
        *(undefined8 *)(puVar23 + 0x30) = uVar8;
        *(undefined8 *)(puVar23 + 0x38) = uVar9;
        uVar24 = local_38;
        puVar1 = local_78;
        puVar23[-8] = '6';
        puVar23[-7] = '1';
        puVar23[-6] = '\x17';
        puVar23[-5] = '\0';
        puVar23[-4] = '\0';
        puVar23[-3] = '\0';
        puVar23[-2] = '\0';
        puVar23[-1] = '\0';
        memcpy(puVar23 + 0x41,puVar1,uVar24);
        puVar23[0x40] = '\x01';
        puVar23[-8] = 'Q';
        puVar23[-7] = '1';
        puVar23[-6] = '\x17';
        puVar23[-5] = '\0';
        puVar23[-4] = '\0';
        puVar23[-3] = '\0';
        puVar23[-2] = '\0';
        puVar23[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(puVar23,puVar21,0x40,puVar23,(uint32_t)__n);
        puVar23[-8] = 'j';
        puVar23[-7] = '1';
        puVar23[-6] = '\x17';
        puVar23[-5] = '\0';
        puVar23[-4] = '\0';
        puVar23[-3] = '\0';
        puVar23[-2] = '\0';
        puVar23[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512((uint8_t *)puVar11,puVar23,0x40,(uint8_t *)puVar11,0x40);
        uVar15 = *(undefined8 *)(puVar23 + 0x10);
        uVar4 = *(undefined8 *)(puVar23 + 0x18);
        uVar5 = *(undefined8 *)(puVar23 + 0x20);
        uVar6 = *(undefined8 *)(puVar23 + 0x28);
        uVar7 = *(undefined8 *)(puVar23 + 0x38);
        *(undefined8 *)(puVar21 + 0x30) = *(undefined8 *)(puVar23 + 0x30);
        *(undefined8 *)(puVar21 + 0x38) = uVar7;
        *(undefined8 *)(puVar21 + 0x20) = uVar5;
        *(undefined8 *)(puVar21 + 0x28) = uVar6;
        *(undefined8 *)(puVar21 + 0x10) = uVar15;
        *(undefined8 *)(puVar21 + 0x18) = uVar4;
        uVar15 = *(undefined8 *)(local_a0 + local_b0 + 8);
        *(undefined8 *)puVar21 = *(undefined8 *)(local_a0 + local_b0);
        *(undefined8 *)(puVar21 + 8) = uVar15;
      }
      *local_b8 = 1;
      if (local_40->tag != '\x03') {
        uVar15 = 0x678;
        puVar23 = local_68;
        goto LAB_00173679;
      }
      local_48 = (local_40->field_1).case_SHA1_s.reseed_counter;
      if (Hacl_HMAC_DRBG_reseed_interval < *local_48) {
        return false;
      }
      uVar22 = (int)local_60 + 0x41;
      puVar21 = (local_40->field_1).case_SHA1_s.k;
      puVar1 = (local_40->field_1).case_SHA1_s.v;
      uVar24 = (ulong)uVar22;
      local_38 = CONCAT44(local_38._4_4_,uVar22);
      local_40 = (EverCrypt_DRBG_state_s *)uVar24;
      if ((int)local_60 != 0) {
        uVar16 = uVar24 + 0xf & 0xfffffffffffffff0;
        puVar23 = local_68 + -uVar16;
        puVar23[-8] = 0x86;
        puVar23[-7] = '2';
        puVar23[-6] = '\x17';
        puVar23[-5] = '\0';
        puVar23[-4] = '\0';
        puVar23[-3] = '\0';
        puVar23[-2] = '\0';
        puVar23[-1] = '\0';
        memset(puVar23,0,uVar24);
        uVar15 = *(undefined8 *)(puVar1 + 8);
        uVar4 = *(undefined8 *)(puVar1 + 0x10);
        uVar5 = *(undefined8 *)(puVar1 + 0x18);
        uVar6 = *(undefined8 *)(puVar1 + 0x20);
        uVar7 = *(undefined8 *)(puVar1 + 0x28);
        uVar8 = *(undefined8 *)(puVar1 + 0x30);
        uVar9 = *(undefined8 *)(puVar1 + 0x38);
        *(undefined8 *)puVar23 = *(undefined8 *)puVar1;
        *(undefined8 *)(puVar23 + 8) = uVar15;
        *(undefined8 *)(puVar23 + 0x10) = uVar4;
        *(undefined8 *)(puVar23 + 0x18) = uVar5;
        *(undefined8 *)(puVar23 + 0x20) = uVar6;
        *(undefined8 *)(puVar23 + 0x28) = uVar7;
        *(undefined8 *)(puVar23 + 0x30) = uVar8;
        *(undefined8 *)(puVar23 + 0x38) = uVar9;
        puVar23[-8] = 0xba;
        puVar23[-7] = '2';
        puVar23[-6] = '\x17';
        puVar23[-5] = '\0';
        puVar23[-4] = '\0';
        puVar23[-3] = '\0';
        puVar23[-2] = '\0';
        puVar23[-1] = '\0';
        memcpy(puVar23 + 0x41,local_58,local_70);
        puVar23[0x40] = '\0';
        puVar23[-8] = 0xd5;
        puVar23[-7] = '2';
        puVar23[-6] = '\x17';
        puVar23[-5] = '\0';
        puVar23[-4] = '\0';
        puVar23[-3] = '\0';
        puVar23[-2] = '\0';
        puVar23[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(puVar23,puVar21,0x40,puVar23,(uint32_t)local_38);
        puVar23[-8] = 0xee;
        puVar23[-7] = '2';
        puVar23[-6] = '\x17';
        puVar23[-5] = '\0';
        puVar23[-4] = '\0';
        puVar23[-3] = '\0';
        puVar23[-2] = '\0';
        puVar23[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(puVar1,puVar23,0x40,puVar1,0x40);
        uVar15 = *(undefined8 *)puVar23;
        uVar4 = *(undefined8 *)(puVar23 + 8);
        uVar5 = *(undefined8 *)(puVar23 + 0x10);
        uVar6 = *(undefined8 *)(puVar23 + 0x18);
        uVar7 = *(undefined8 *)(puVar23 + 0x20);
        uVar8 = *(undefined8 *)(puVar23 + 0x28);
        uVar9 = *(undefined8 *)(puVar23 + 0x38);
        *(undefined8 *)(puVar21 + 0x30) = *(undefined8 *)(puVar23 + 0x30);
        *(undefined8 *)(puVar21 + 0x38) = uVar9;
        *(undefined8 *)(puVar21 + 0x20) = uVar7;
        *(undefined8 *)(puVar21 + 0x28) = uVar8;
        *(undefined8 *)(puVar21 + 0x10) = uVar5;
        *(undefined8 *)(puVar21 + 0x18) = uVar6;
        *(undefined8 *)puVar21 = uVar15;
        *(undefined8 *)(puVar21 + 8) = uVar4;
        puVar23 = puVar23 + -uVar16;
        uVar14 = (uint32_t)local_38;
        puVar23[-8] = '+';
        puVar23[-7] = '3';
        puVar23[-6] = '\x17';
        puVar23[-5] = '\0';
        puVar23[-4] = '\0';
        puVar23[-3] = '\0';
        puVar23[-2] = '\0';
        puVar23[-1] = '\0';
        memset(puVar23,0,(size_t)local_40);
        uVar15 = *(undefined8 *)(puVar1 + 8);
        uVar4 = *(undefined8 *)(puVar1 + 0x10);
        uVar5 = *(undefined8 *)(puVar1 + 0x18);
        uVar6 = *(undefined8 *)(puVar1 + 0x20);
        uVar7 = *(undefined8 *)(puVar1 + 0x28);
        uVar8 = *(undefined8 *)(puVar1 + 0x30);
        uVar9 = *(undefined8 *)(puVar1 + 0x38);
        *(undefined8 *)puVar23 = *(undefined8 *)puVar1;
        *(undefined8 *)(puVar23 + 8) = uVar15;
        *(undefined8 *)(puVar23 + 0x10) = uVar4;
        *(undefined8 *)(puVar23 + 0x18) = uVar5;
        *(undefined8 *)(puVar23 + 0x20) = uVar6;
        *(undefined8 *)(puVar23 + 0x28) = uVar7;
        *(undefined8 *)(puVar23 + 0x30) = uVar8;
        *(undefined8 *)(puVar23 + 0x38) = uVar9;
        puVar23[-8] = '_';
        puVar23[-7] = '3';
        puVar23[-6] = '\x17';
        puVar23[-5] = '\0';
        puVar23[-4] = '\0';
        puVar23[-3] = '\0';
        puVar23[-2] = '\0';
        puVar23[-1] = '\0';
        memcpy(puVar23 + 0x41,local_58,local_70);
        puVar23[0x40] = '\x01';
        puVar23[-8] = 'y';
        puVar23[-7] = '3';
        puVar23[-6] = '\x17';
        puVar23[-5] = '\0';
        puVar23[-4] = '\0';
        puVar23[-3] = '\0';
        puVar23[-2] = '\0';
        puVar23[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(puVar23,puVar21,0x40,puVar23,uVar14);
        puVar23[-8] = 0x92;
        puVar23[-7] = '3';
        puVar23[-6] = '\x17';
        puVar23[-5] = '\0';
        puVar23[-4] = '\0';
        puVar23[-3] = '\0';
        puVar23[-2] = '\0';
        puVar23[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(puVar1,puVar23,0x40,puVar1,0x40);
        uVar15 = *(undefined8 *)puVar23;
        uVar4 = *(undefined8 *)(puVar23 + 8);
        uVar5 = *(undefined8 *)(puVar23 + 0x10);
        uVar6 = *(undefined8 *)(puVar23 + 0x18);
        uVar7 = *(undefined8 *)(puVar23 + 0x20);
        uVar8 = *(undefined8 *)(puVar23 + 0x28);
        uVar9 = *(undefined8 *)(puVar23 + 0x38);
        *(undefined8 *)(puVar21 + 0x30) = *(undefined8 *)(puVar23 + 0x30);
        *(undefined8 *)(puVar21 + 0x38) = uVar9;
        *(undefined8 *)(puVar21 + 0x20) = uVar7;
        *(undefined8 *)(puVar21 + 0x28) = uVar8;
        *(undefined8 *)(puVar21 + 0x10) = uVar5;
        *(undefined8 *)(puVar21 + 0x18) = uVar6;
        *(undefined8 *)puVar21 = uVar15;
        *(undefined8 *)(puVar21 + 8) = uVar4;
      }
      puVar10 = local_68;
      if (0x3f < (uint)local_50) {
        uVar22 = (uint)local_50 & 0xffffffc0;
        uVar24 = 0;
        do {
          *(undefined8 *)(puVar10 + -8) = 0x1733e1;
          EverCrypt_HMAC_compute_sha2_512(puVar1,puVar21,0x40,puVar1,0x40);
          uVar15 = *(undefined8 *)puVar1;
          uVar4 = *(undefined8 *)(puVar1 + 8);
          uVar5 = *(undefined8 *)(puVar1 + 0x10);
          uVar6 = *(undefined8 *)(puVar1 + 0x18);
          uVar7 = *(undefined8 *)(puVar1 + 0x20);
          uVar8 = *(undefined8 *)(puVar1 + 0x28);
          uVar9 = *(undefined8 *)(puVar1 + 0x38);
          *(undefined8 *)(output + uVar24 + 0x30) = *(undefined8 *)(puVar1 + 0x30);
          *(undefined8 *)(output + uVar24 + 0x30 + 8) = uVar9;
          *(undefined8 *)(output + uVar24 + 0x20) = uVar7;
          *(undefined8 *)(output + uVar24 + 0x20 + 8) = uVar8;
          *(undefined8 *)(output + uVar24 + 0x10) = uVar5;
          *(undefined8 *)(output + uVar24 + 0x10 + 8) = uVar6;
          *(undefined8 *)(output + uVar24) = uVar15;
          *(undefined8 *)(output + uVar24 + 8) = uVar4;
          uVar24 = uVar24 + 0x40;
        } while (uVar22 != uVar24);
      }
      uVar22 = (uint)local_50;
      if ((uVar22 & 0xffffffc0) != uVar22) {
        *(undefined8 *)(puVar10 + -8) = 0x173440;
        EverCrypt_HMAC_compute_sha2_512(puVar1,puVar21,0x40,puVar1,0x40);
        *(undefined8 *)(puVar10 + -8) = 0x173451;
        memcpy(output + (uVar22 & 0xffffffc0),puVar1,(ulong)(uVar22 & 0x3f));
      }
      uVar24 = (long)local_40 + 0xfU & 0xfffffffffffffff0;
      puVar23 = puVar10 + -uVar24;
      puVar23[-8] = 'w';
      puVar23[-7] = '4';
      puVar23[-6] = '\x17';
      puVar23[-5] = '\0';
      puVar23[-4] = '\0';
      puVar23[-3] = '\0';
      puVar23[-2] = '\0';
      puVar23[-1] = '\0';
      local_68 = puVar10;
      memset(puVar23,0,(size_t)local_40);
      uVar15 = *(undefined8 *)puVar1;
      uVar4 = *(undefined8 *)(puVar1 + 8);
      uVar5 = *(undefined8 *)(puVar1 + 0x10);
      uVar6 = *(undefined8 *)(puVar1 + 0x18);
      uVar7 = *(undefined8 *)(puVar1 + 0x20);
      uVar8 = *(undefined8 *)(puVar1 + 0x28);
      uVar9 = *(undefined8 *)(puVar1 + 0x38);
      *(undefined8 *)(puVar10 + -uVar24 + 0x30) = *(undefined8 *)(puVar1 + 0x30);
      *(undefined8 *)((long)(puVar10 + -uVar24 + 0x30) + 8) = uVar9;
      *(undefined8 *)puVar23 = uVar15;
      *(undefined8 *)(puVar23 + 8) = uVar4;
      *(undefined8 *)(puVar23 + 0x10) = uVar5;
      *(undefined8 *)(puVar23 + 0x18) = uVar6;
      *(undefined8 *)(puVar23 + 0x20) = uVar7;
      *(undefined8 *)(puVar23 + 0x28) = uVar8;
      if ((int)local_60 == 0) {
        puVar23[0x40] = '\0';
        puVar23[-8] = 0xec;
        puVar23[-7] = '5';
        puVar23[-6] = '\x17';
        puVar23[-5] = '\0';
        puVar23[-4] = '\0';
        puVar23[-3] = '\0';
        puVar23[-2] = '\0';
        puVar23[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(puVar23,puVar21,0x40,puVar23,(uint32_t)local_38);
        builtin_memcpy(puVar10 + -uVar24 + -8,"\x056\x17",4);
        puVar23[-4] = '\0';
        puVar23[-3] = '\0';
        puVar23[-2] = '\0';
        puVar23[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(puVar1,puVar23,0x40,puVar1,0x40);
        uVar15 = *(undefined8 *)puVar23;
        uVar4 = *(undefined8 *)(puVar23 + 8);
        uVar5 = *(undefined8 *)(puVar23 + 0x10);
        uVar6 = *(undefined8 *)(puVar23 + 0x18);
        uVar7 = *(undefined8 *)(puVar23 + 0x20);
        uVar8 = *(undefined8 *)(puVar23 + 0x28);
        uVar9 = *(undefined8 *)(puVar23 + 0x38);
        *(undefined8 *)(puVar21 + 0x30) = *(undefined8 *)(puVar23 + 0x30);
        *(undefined8 *)(puVar21 + 0x38) = uVar9;
        *(undefined8 *)(puVar21 + 0x20) = uVar7;
        *(undefined8 *)(puVar21 + 0x28) = uVar8;
        *(undefined8 *)(puVar21 + 0x10) = uVar5;
        *(undefined8 *)(puVar21 + 0x18) = uVar6;
        *(undefined8 *)puVar21 = uVar15;
        *(undefined8 *)(puVar21 + 8) = uVar4;
      }
      else {
        puVar23[-8] = 0xc1;
        puVar23[-7] = '4';
        puVar23[-6] = '\x17';
        puVar23[-5] = '\0';
        puVar23[-4] = '\0';
        puVar23[-3] = '\0';
        puVar23[-2] = '\0';
        puVar23[-1] = '\0';
        local_60 = -uVar24;
        memcpy(puVar23 + 0x41,local_58,local_70);
        puVar23[0x40] = '\0';
        uVar14 = (uint32_t)local_38;
        puVar23[-8] = 0xdf;
        puVar23[-7] = '4';
        puVar23[-6] = '\x17';
        puVar23[-5] = '\0';
        puVar23[-4] = '\0';
        puVar23[-3] = '\0';
        puVar23[-2] = '\0';
        puVar23[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(puVar23,puVar21,0x40,puVar23,(uint32_t)local_38);
        puVar23[-8] = 0xf8;
        puVar23[-7] = '4';
        puVar23[-6] = '\x17';
        puVar23[-5] = '\0';
        puVar23[-4] = '\0';
        puVar23[-3] = '\0';
        puVar23[-2] = '\0';
        puVar23[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(puVar1,puVar23,0x40,puVar1,0x40);
        uVar15 = *(undefined8 *)puVar23;
        uVar4 = *(undefined8 *)(puVar23 + 8);
        uVar5 = *(undefined8 *)(puVar23 + 0x10);
        uVar6 = *(undefined8 *)(puVar23 + 0x18);
        uVar7 = *(undefined8 *)(puVar23 + 0x20);
        uVar8 = *(undefined8 *)(puVar23 + 0x28);
        uVar9 = *(undefined8 *)(puVar23 + 0x38);
        *(undefined8 *)(puVar21 + 0x30) = *(undefined8 *)(puVar23 + 0x30);
        *(undefined8 *)(puVar21 + 0x38) = uVar9;
        *(undefined8 *)(puVar21 + 0x20) = uVar7;
        *(undefined8 *)(puVar21 + 0x28) = uVar8;
        *(undefined8 *)(puVar21 + 0x10) = uVar5;
        *(undefined8 *)(puVar21 + 0x18) = uVar6;
        *(undefined8 *)puVar21 = uVar15;
        *(undefined8 *)(puVar21 + 8) = uVar4;
        puVar20 = puVar23 + -uVar24;
        puVar20[-8] = '9';
        puVar20[-7] = '5';
        puVar20[-6] = '\x17';
        puVar20[-5] = '\0';
        puVar20[-4] = '\0';
        puVar20[-3] = '\0';
        puVar20[-2] = '\0';
        puVar20[-1] = '\0';
        local_78 = puVar23;
        local_50 = puVar23;
        memset(puVar20,0,(size_t)local_40);
        uVar15 = *(undefined8 *)(puVar1 + 8);
        uVar4 = *(undefined8 *)(puVar1 + 0x10);
        uVar5 = *(undefined8 *)(puVar1 + 0x18);
        uVar6 = *(undefined8 *)(puVar1 + 0x20);
        uVar7 = *(undefined8 *)(puVar1 + 0x28);
        uVar8 = *(undefined8 *)(puVar1 + 0x30);
        uVar9 = *(undefined8 *)(puVar1 + 0x38);
        *(undefined8 *)puVar20 = *(undefined8 *)puVar1;
        *(undefined8 *)(puVar20 + 8) = uVar15;
        *(undefined8 *)(puVar20 + 0x10) = uVar4;
        *(undefined8 *)(puVar20 + 0x18) = uVar5;
        *(undefined8 *)(puVar20 + 0x20) = uVar6;
        *(undefined8 *)(puVar20 + 0x28) = uVar7;
        *(undefined8 *)(puVar20 + 0x30) = uVar8;
        *(undefined8 *)(puVar20 + 0x38) = uVar9;
        puVar20[-8] = 'm';
        puVar20[-7] = '5';
        puVar20[-6] = '\x17';
        puVar20[-5] = '\0';
        puVar20[-4] = '\0';
        puVar20[-3] = '\0';
        puVar20[-2] = '\0';
        puVar20[-1] = '\0';
        memcpy(puVar20 + 0x41,local_58,local_70);
        puVar20[0x40] = '\x01';
        puVar20[-8] = 0x87;
        puVar20[-7] = '5';
        puVar20[-6] = '\x17';
        puVar20[-5] = '\0';
        puVar20[-4] = '\0';
        puVar20[-3] = '\0';
        puVar20[-2] = '\0';
        puVar20[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(puVar20,puVar21,0x40,puVar20,uVar14);
        puVar20[-8] = 0xa0;
        puVar20[-7] = '5';
        puVar20[-6] = '\x17';
        puVar20[-5] = '\0';
        puVar20[-4] = '\0';
        puVar20[-3] = '\0';
        puVar20[-2] = '\0';
        puVar20[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(puVar1,puVar20,0x40,puVar1,0x40);
        uVar15 = *(undefined8 *)(puVar20 + 0x10);
        uVar4 = *(undefined8 *)(puVar20 + 0x18);
        uVar5 = *(undefined8 *)(puVar20 + 0x20);
        uVar6 = *(undefined8 *)(puVar20 + 0x28);
        uVar7 = *(undefined8 *)(puVar20 + 0x38);
        *(undefined8 *)(puVar21 + 0x30) = *(undefined8 *)(puVar20 + 0x30);
        *(undefined8 *)(puVar21 + 0x38) = uVar7;
        *(undefined8 *)(puVar21 + 0x20) = uVar5;
        *(undefined8 *)(puVar21 + 0x28) = uVar6;
        *(undefined8 *)(puVar21 + 0x10) = uVar15;
        *(undefined8 *)(puVar21 + 0x18) = uVar4;
        uVar15 = *(undefined8 *)(local_78 + local_60 + 8);
        *(undefined8 *)puVar21 = *(undefined8 *)(local_78 + local_60);
        *(undefined8 *)(puVar21 + 8) = uVar15;
      }
      *local_48 = *local_48 + 1;
      uVar16 = (ulong)local_84;
    }
    uVar12 = (undefined1)uVar16;
  }
  return (_Bool)uVar12;
}

Assistant:

static bool
generate_sha2_512(
  uint8_t *output,
  EverCrypt_DRBG_state_s *st,
  uint32_t n,
  uint8_t *additional_input,
  uint32_t additional_input_len
)
{
  if
  (
    additional_input_len
    > Hacl_HMAC_DRBG_max_additional_input_length
    || n > Hacl_HMAC_DRBG_max_output_length
  )
  {
    return false;
  }
  bool ok0;
  if (additional_input_len > Hacl_HMAC_DRBG_max_additional_input_length)
  {
    ok0 = false;
  }
  else
  {
    uint32_t entropy_input_len = Hacl_HMAC_DRBG_min_length(Spec_Hash_Definitions_SHA2_512);
    KRML_CHECK_SIZE(sizeof (uint8_t), entropy_input_len);
    uint8_t entropy_input[entropy_input_len];
    memset(entropy_input, 0U, entropy_input_len * sizeof (uint8_t));
    bool ok = Lib_RandomBuffer_System_randombytes(entropy_input, entropy_input_len);
    bool result;
    if (!ok)
    {
      result = false;
    }
    else
    {
      EverCrypt_DRBG_state_s st_s = *st;
      KRML_CHECK_SIZE(sizeof (uint8_t), entropy_input_len + additional_input_len);
      uint8_t seed_material[entropy_input_len + additional_input_len];
      memset(seed_material, 0U, (entropy_input_len + additional_input_len) * sizeof (uint8_t));
      memcpy(seed_material, entropy_input, entropy_input_len * sizeof (uint8_t));
      memcpy(seed_material + entropy_input_len,
        additional_input,
        additional_input_len * sizeof (uint8_t));
      Hacl_HMAC_DRBG_state scrut;
      if (st_s.tag == SHA2_512_s)
      {
        scrut = st_s.case_SHA2_512_s;
      }
      else
      {
        scrut =
          KRML_EABORT(Hacl_HMAC_DRBG_state,
            "unreachable (pattern matches are exhaustive in F*)");
      }
      uint8_t *k = scrut.k;
      uint8_t *v = scrut.v;
      uint32_t *ctr = scrut.reseed_counter;
      uint32_t input_len = 65U + entropy_input_len + additional_input_len;
      KRML_CHECK_SIZE(sizeof (uint8_t), input_len);
      uint8_t input0[input_len];
      memset(input0, 0U, input_len * sizeof (uint8_t));
      uint8_t *k_ = input0;
      memcpy(k_, v, 64U * sizeof (uint8_t));
      if (entropy_input_len + additional_input_len != 0U)
      {
        memcpy(input0 + 65U,
          seed_material,
          (entropy_input_len + additional_input_len) * sizeof (uint8_t));
      }
      input0[64U] = 0U;
      EverCrypt_HMAC_compute_sha2_512(k_, k, 64U, input0, input_len);
      EverCrypt_HMAC_compute_sha2_512(v, k_, 64U, v, 64U);
      memcpy(k, k_, 64U * sizeof (uint8_t));
      if (entropy_input_len + additional_input_len != 0U)
      {
        uint32_t input_len0 = 65U + entropy_input_len + additional_input_len;
        KRML_CHECK_SIZE(sizeof (uint8_t), input_len0);
        uint8_t input[input_len0];
        memset(input, 0U, input_len0 * sizeof (uint8_t));
        uint8_t *k_0 = input;
        memcpy(k_0, v, 64U * sizeof (uint8_t));
        if (entropy_input_len + additional_input_len != 0U)
        {
          memcpy(input + 65U,
            seed_material,
            (entropy_input_len + additional_input_len) * sizeof (uint8_t));
        }
        input[64U] = 1U;
        EverCrypt_HMAC_compute_sha2_512(k_0, k, 64U, input, input_len0);
        EverCrypt_HMAC_compute_sha2_512(v, k_0, 64U, v, 64U);
        memcpy(k, k_0, 64U * sizeof (uint8_t));
      }
      ctr[0U] = 1U;
      result = true;
    }
    ok0 = result;
  }
  if (!ok0)
  {
    return false;
  }
  EverCrypt_DRBG_state_s st_s = *st;
  Hacl_HMAC_DRBG_state ite;
  if (st_s.tag == SHA2_512_s)
  {
    ite = st_s.case_SHA2_512_s;
  }
  else
  {
    ite = KRML_EABORT(Hacl_HMAC_DRBG_state, "unreachable (pattern matches are exhaustive in F*)");
  }
  if (ite.reseed_counter[0U] > Hacl_HMAC_DRBG_reseed_interval)
  {
    return false;
  }
  Hacl_HMAC_DRBG_state scrut;
  if (st_s.tag == SHA2_512_s)
  {
    scrut = st_s.case_SHA2_512_s;
  }
  else
  {
    scrut = KRML_EABORT(Hacl_HMAC_DRBG_state, "unreachable (pattern matches are exhaustive in F*)");
  }
  uint8_t *k = scrut.k;
  uint8_t *v = scrut.v;
  uint32_t *ctr = scrut.reseed_counter;
  if (additional_input_len > 0U)
  {
    uint32_t input_len = 65U + additional_input_len;
    KRML_CHECK_SIZE(sizeof (uint8_t), input_len);
    uint8_t input0[input_len];
    memset(input0, 0U, input_len * sizeof (uint8_t));
    uint8_t *k_ = input0;
    memcpy(k_, v, 64U * sizeof (uint8_t));
    if (additional_input_len != 0U)
    {
      memcpy(input0 + 65U, additional_input, additional_input_len * sizeof (uint8_t));
    }
    input0[64U] = 0U;
    EverCrypt_HMAC_compute_sha2_512(k_, k, 64U, input0, input_len);
    EverCrypt_HMAC_compute_sha2_512(v, k_, 64U, v, 64U);
    memcpy(k, k_, 64U * sizeof (uint8_t));
    if (additional_input_len != 0U)
    {
      uint32_t input_len0 = 65U + additional_input_len;
      KRML_CHECK_SIZE(sizeof (uint8_t), input_len0);
      uint8_t input[input_len0];
      memset(input, 0U, input_len0 * sizeof (uint8_t));
      uint8_t *k_0 = input;
      memcpy(k_0, v, 64U * sizeof (uint8_t));
      if (additional_input_len != 0U)
      {
        memcpy(input + 65U, additional_input, additional_input_len * sizeof (uint8_t));
      }
      input[64U] = 1U;
      EverCrypt_HMAC_compute_sha2_512(k_0, k, 64U, input, input_len0);
      EverCrypt_HMAC_compute_sha2_512(v, k_0, 64U, v, 64U);
      memcpy(k, k_0, 64U * sizeof (uint8_t));
    }
  }
  uint8_t *output1 = output;
  uint32_t max = n / 64U;
  uint8_t *out = output1;
  for (uint32_t i = 0U; i < max; i++)
  {
    EverCrypt_HMAC_compute_sha2_512(v, k, 64U, v, 64U);
    memcpy(out + i * 64U, v, 64U * sizeof (uint8_t));
  }
  if (max * 64U < n)
  {
    uint8_t *block = output1 + max * 64U;
    EverCrypt_HMAC_compute_sha2_512(v, k, 64U, v, 64U);
    memcpy(block, v, (n - max * 64U) * sizeof (uint8_t));
  }
  uint32_t input_len = 65U + additional_input_len;
  KRML_CHECK_SIZE(sizeof (uint8_t), input_len);
  uint8_t input0[input_len];
  memset(input0, 0U, input_len * sizeof (uint8_t));
  uint8_t *k_ = input0;
  memcpy(k_, v, 64U * sizeof (uint8_t));
  if (additional_input_len != 0U)
  {
    memcpy(input0 + 65U, additional_input, additional_input_len * sizeof (uint8_t));
  }
  input0[64U] = 0U;
  EverCrypt_HMAC_compute_sha2_512(k_, k, 64U, input0, input_len);
  EverCrypt_HMAC_compute_sha2_512(v, k_, 64U, v, 64U);
  memcpy(k, k_, 64U * sizeof (uint8_t));
  if (additional_input_len != 0U)
  {
    uint32_t input_len0 = 65U + additional_input_len;
    KRML_CHECK_SIZE(sizeof (uint8_t), input_len0);
    uint8_t input[input_len0];
    memset(input, 0U, input_len0 * sizeof (uint8_t));
    uint8_t *k_0 = input;
    memcpy(k_0, v, 64U * sizeof (uint8_t));
    if (additional_input_len != 0U)
    {
      memcpy(input + 65U, additional_input, additional_input_len * sizeof (uint8_t));
    }
    input[64U] = 1U;
    EverCrypt_HMAC_compute_sha2_512(k_0, k, 64U, input, input_len0);
    EverCrypt_HMAC_compute_sha2_512(v, k_0, 64U, v, 64U);
    memcpy(k, k_0, 64U * sizeof (uint8_t));
  }
  uint32_t old_ctr = ctr[0U];
  ctr[0U] = old_ctr + 1U;
  return true;
}